

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_base64.cpp
# Opt level: O0

wchar_t * __thiscall ON_DecodeBase64::Decode(ON_DecodeBase64 *this,wchar_t *base64str)

{
  wchar_t wVar1;
  wchar_t *pwVar2;
  wchar_t *pwStack_28;
  wchar_t w;
  wchar_t *p;
  wchar_t *base64str_local;
  ON_DecodeBase64 *this_local;
  
  pwStack_28 = base64str;
  if (base64str == (wchar_t *)0x0) {
    this_local = (ON_DecodeBase64 *)0x0;
  }
  else {
    do {
      pwVar2 = pwStack_28 + 1;
      wVar1 = *pwStack_28;
      if (wVar1 < L' ') break;
      pwStack_28 = pwVar2;
    } while (wVar1 < L'{');
    this_local = (ON_DecodeBase64 *)Decode(this,base64str,(long)pwVar2 - (long)base64str >> 2);
  }
  return (wchar_t *)this_local;
}

Assistant:

const wchar_t* ON_DecodeBase64::Decode(const wchar_t* base64str)
{
  const wchar_t* p;
  wchar_t w;
  if ( 0 == base64str )
    return 0;
  p = base64str;
  for(;;)
  {
    w = *p++;
    if ( w < 32 || w > 122 )
      break;
  }
  return Decode(base64str,p-base64str);
}